

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.hpp
# Opt level: O0

int trial::protocol::core::detail::countr_zero<int>(int x)

{
  int iVar1;
  int x_local;
  
  iVar1 = detail::countr_zero(x);
  return iVar1;
}

Assistant:

constexpr int countr_zero(T x) noexcept
{
#if defined(__GNUC__) || defined(__clang__)
    return detail::countr_zero(typename std::make_unsigned<T>::type(x));
#elif defined(_MSC_VER)
    unsigned long trailing_zeroes = 0;
    _BitScanForward(&trailing_zeroes, static_cast<unsigned long>(x));
    return trailing_zeroes;
#else
# error "No countr_zero implementation"
#endif
}